

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyBeginRenderPassAttribs(BeginRenderPassAttribs *Attribs)

{
  Char *pCVar1;
  TEXTURE_FORMAT *pTVar2;
  char (*in_RCX) [35];
  char (*in_R9) [38];
  char (*in_stack_ffffffffffffff10) [15];
  undefined1 local_c8 [8];
  string msg_3;
  undefined1 local_a0 [8];
  string msg_2;
  TextureFormatAttribs *FmtAttribs;
  RenderPassAttachmentDesc *Attchmnt;
  Uint32 i;
  Uint32 NumRequiredClearValues;
  RenderPassDesc *RPDesc;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  BeginRenderPassAttribs *Attribs_local;
  
  msg.field_2._8_8_ = Attribs;
  if (Attribs->pRenderPass == (IRenderPass *)0x0) {
    FormatString<char[40],char[35]>
              ((string *)local_30,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pRenderPass pass must not be null.",in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [35])0x145;
    DebugAssertionFailed
              (pCVar1,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x145);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (*(long *)(msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[40],char[31]>
              ((string *)&RPDesc,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pFramebuffer must not be null.",(char (*) [31])in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x146);
    std::__cxx11::string::~string((string *)&RPDesc);
  }
  _i = (**(code **)(**(long **)msg.field_2._8_8_ + 0x20))();
  Attchmnt._4_4_ = 0;
  for (Attchmnt._0_4_ = 0; (uint)Attchmnt < *(uint *)(_i + 8); Attchmnt._0_4_ = (uint)Attchmnt + 1)
  {
    pTVar2 = (TEXTURE_FORMAT *)(*(long *)(_i + 0x10) + (ulong)(uint)Attchmnt * 0x10);
    if (*(byte *)((long)pTVar2 + 3) == 1) {
      Attchmnt._4_4_ = (uint)Attchmnt + 1;
    }
    msg_2.field_2._8_8_ = GetTextureFormatAttribs(*pTVar2);
    if ((((TextureFormatAttribs *)msg_2.field_2._8_8_)->ComponentType ==
         COMPONENT_TYPE_DEPTH_STENCIL) && (*(byte *)((long)pTVar2 + 5) == 1)) {
      Attchmnt._4_4_ = (uint)Attchmnt + 1;
    }
  }
  if (*(uint *)(msg.field_2._8_8_ + 0x10) < Attchmnt._4_4_) {
    msg_3.field_2._12_4_ = *(undefined4 *)(msg.field_2._8_8_ + 0x10);
    in_R9 = (char (*) [38])((long)&msg_3.field_2 + 0xc);
    FormatString<char[40],char[10],unsigned_int,char[38],unsigned_int,char[15]>
              ((string *)local_a0,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])0x486f96,(char (*) [10])((long)&Attchmnt + 4),
               (uint *)" clear values are required, but only ",in_R9,(uint *)" are provided.",
               in_stack_ffffffffffffff10);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x15b);
    std::__cxx11::string::~string((string *)local_a0);
  }
  if ((*(int *)(msg.field_2._8_8_ + 0x10) != 0) && (*(long *)(msg.field_2._8_8_ + 0x18) == 0)) {
    FormatString<char[40],char[53],unsigned_int,char[15]>
              ((string *)local_c8,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pClearValues must not be null when ClearValueCount (",
               (char (*) [53])(msg.field_2._8_8_ + 0x10),(uint *)") is not zero.",
               (char (*) [15])in_R9);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x15d);
    std::__cxx11::string::~string((string *)local_c8);
  }
  return true;
}

Assistant:

bool VerifyBeginRenderPassAttribs(const BeginRenderPassAttribs& Attribs)
{
#define CHECK_BEGIN_RENDER_PASS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Begin render pass attribs are invalid: ", __VA_ARGS__)

    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.pRenderPass != nullptr, "pRenderPass pass must not be null.");
    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.pFramebuffer != nullptr, "pFramebuffer must not be null.");

    const RenderPassDesc& RPDesc = Attribs.pRenderPass->GetDesc();

    Uint32 NumRequiredClearValues = 0;
    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        const RenderPassAttachmentDesc& Attchmnt = RPDesc.pAttachments[i];
        if (Attchmnt.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
            NumRequiredClearValues = i + 1;

        const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Attchmnt.Format);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (Attchmnt.StencilLoadOp == ATTACHMENT_LOAD_OP_CLEAR)
                NumRequiredClearValues = i + 1;
        }
    }

    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.ClearValueCount >= NumRequiredClearValues,
                                    "at least ", NumRequiredClearValues, " clear values are required, but only ",
                                    Uint32{Attribs.ClearValueCount}, " are provided.");
    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.ClearValueCount == 0 || Attribs.pClearValues != nullptr,
                                    "pClearValues must not be null when ClearValueCount (", Attribs.ClearValueCount, ") is not zero.");

#undef CHECK_BEGIN_RENDER_PASS_ATTRIBS

    return true;
}